

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O2

DecoderResult * ZXing::DataMatrix::Decode(DecoderResult *__return_storage_ptr__,BitMatrix *bits)

{
  bool val;
  int y;
  uint y_00;
  int x;
  int x_00;
  int iVar1;
  BitMatrix local_120;
  DecoderResult res;
  
  DoDecode(&res,bits);
  if ((res._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start ==
       res._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish) || (res._error._type != None)) {
    BitMatrix::BitMatrix(&local_120,bits->_height,bits->_width);
    for (y_00 = 0; (int)y_00 < local_120._height; y_00 = y_00 + 1) {
      iVar1 = -1;
      for (x_00 = 0; x_00 < local_120._width; x_00 = x_00 + 1) {
        val = BitMatrix::get(bits,bits->_width + ~y_00,bits->_height + iVar1);
        BitMatrix::set(&local_120,x_00,y_00,val);
        iVar1 = iVar1 + -1;
      }
    }
    DoDecode(__return_storage_ptr__,&local_120);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_120._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (((__return_storage_ptr__->_content).bytes.
         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (__return_storage_ptr__->_content).bytes.
         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish) && ((__return_storage_ptr__->_error)._type == None)) {
      __return_storage_ptr__->_isMirrored = true;
      goto LAB_00163776;
    }
    DecoderResult::~DecoderResult(__return_storage_ptr__);
  }
  DecoderResult::DecoderResult(__return_storage_ptr__,&res);
LAB_00163776:
  DecoderResult::~DecoderResult(&res);
  return __return_storage_ptr__;
}

Assistant:

DecoderResult Decode(const BitMatrix& bits)
{
	auto res = DoDecode(bits);
	if (res.isValid())
		return res;

	//TODO:
	// * unify bit mirroring helper code with QRReader?
	// * rectangular symbols with the a size of 8 x Y are not supported a.t.m.
	if (auto mirroredRes = DoDecode(FlippedL(bits)); mirroredRes.isValid()) {
		mirroredRes.setIsMirrored(true);
		return mirroredRes;
	}

	return res;
}